

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O0

void __thiscall
helics::apps::Tracer::captureForCurrentTime(Tracer *this,Time currentTime,int iteration)

{
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  pointer pMVar4;
  ostream *poVar5;
  pointer pMVar6;
  size_t sVar7;
  pointer pMVar8;
  int in_EDX;
  Core *in_RSI;
  long in_RDI;
  string_view sVar9;
  string messstr_1;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess_1;
  string messstr;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  Endpoint *ept;
  iterator __end2_1;
  iterator __begin2_1;
  deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *__range2_1;
  string valstr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  Input *sub;
  iterator __end2;
  iterator __begin2;
  deque<helics::Input,_std::allocator<helics::Input>_> *__range2;
  Input *in_stack_fffffffffffff4d8;
  Input *in_stack_fffffffffffff4e0;
  Input *in_stack_fffffffffffff4e8;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffff4f0;
  char *in_stack_fffffffffffff4f8;
  TimeRepresentation<count_time<9,_long>_> in_stack_fffffffffffff500;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff530;
  undefined1 local_a08 [88];
  char *local_9b0;
  double local_9a8;
  char *local_9a0;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_998;
  string local_970 [48];
  __sv_type local_940;
  _Alloc_hider local_930;
  size_t local_928;
  undefined1 local_920 [16];
  double local_910;
  undefined1 local_908 [32];
  string_view local_8e8;
  double local_8d8;
  char *local_8d0;
  undefined8 local_8c8;
  format_args in_stack_fffffffffffff740;
  string_view in_stack_fffffffffffff750;
  string local_8a0 [40];
  reference local_878;
  _Self local_870;
  _Self local_850;
  long local_830;
  __sv_type local_828;
  __sv_type local_818;
  Core *local_808;
  size_type local_800;
  double local_7f8;
  char *local_7f0;
  undefined8 local_7e8;
  undefined1 local_7e0 [32];
  size_type local_7c0;
  double local_7b8;
  char *local_7b0;
  undefined8 local_7a8;
  undefined1 local_7a0 [32];
  double local_780;
  char *local_778;
  undefined8 local_770;
  undefined1 local_768 [48];
  double local_738;
  char *local_730;
  undefined8 local_728;
  undefined1 local_720 [32];
  string local_700 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  reference local_6c0;
  _Self local_6b8;
  _Self local_698;
  long local_678;
  int local_66c [3];
  Core *local_660;
  double local_658 [2];
  undefined1 local_648 [48];
  undefined8 local_618;
  double *local_610;
  char *local_608;
  undefined8 uStack_600;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5f0;
  string *local_5e8;
  int *local_5e0;
  double *local_5d8;
  char *local_5d0;
  undefined8 uStack_5c8;
  undefined1 *local_5c0;
  double local_5b8 [6];
  undefined8 local_588;
  double *local_580;
  char *local_578;
  undefined8 uStack_570;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_568;
  string *local_560;
  double *local_558;
  char *local_550;
  undefined8 uStack_548;
  undefined1 *local_540;
  double local_538 [2];
  undefined1 local_528 [32];
  size_type local_508 [2];
  undefined8 local_4f8;
  double *local_4f0;
  char *local_4e8;
  undefined8 uStack_4e0;
  size_type *local_4d0;
  string *local_4c8;
  int *local_4c0;
  double *local_4b8;
  char *local_4b0;
  undefined8 uStack_4a8;
  undefined1 *local_4a0;
  double local_498 [4];
  size_type local_478 [2];
  undefined8 local_468;
  double *local_460;
  char *local_458;
  undefined8 uStack_450;
  size_type *local_448;
  string *local_440;
  double *local_438;
  char *local_430;
  undefined8 uStack_428;
  undefined1 *local_420;
  double local_418 [8];
  undefined8 local_3d8;
  double *local_3d0;
  char *local_3c8;
  _Uninitialized<double,_true> _Stack_3c0;
  undefined1 *local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a8;
  string *local_3a0;
  double *local_398;
  char *local_390;
  _Uninitialized<double,_true> _Stack_388;
  long local_380;
  double local_378 [8];
  undefined8 local_338;
  double *local_330;
  char *local_328;
  undefined8 uStack_320;
  string_view *local_310;
  string *local_308;
  string *local_300;
  double *local_2f8;
  char *local_2f0;
  undefined8 uStack_2e8;
  undefined1 *local_2e0;
  pointer local_2d8 [6];
  undefined8 local_2a8 [2];
  undefined8 local_298;
  pointer *local_290;
  char *local_288;
  size_type sStack_280;
  undefined8 *local_270;
  string *local_268;
  string *local_260;
  undefined1 *local_258;
  char *local_250;
  size_type sStack_248;
  undefined1 *local_240;
  double local_238 [6];
  size_t local_208 [2];
  undefined8 local_1f8;
  double *local_1f0;
  char *local_1e8;
  double dStack_1e0;
  size_t *local_1d8;
  string *local_1d0;
  string *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  double dStack_1b0;
  undefined1 *local_1a8;
  double local_1a0;
  double *local_198;
  pointer local_190;
  pointer *local_188;
  double local_180;
  double *local_178;
  double local_170;
  double *local_168;
  double local_160;
  double *local_158;
  double local_150;
  double *local_148;
  double local_140;
  double *local_138;
  double local_130;
  double *local_128;
  undefined1 *local_118;
  undefined1 *local_108;
  double *local_100;
  undefined8 *local_f8;
  double *local_f0;
  undefined8 *local_e8;
  size_t local_e0;
  size_t *local_d8;
  undefined8 local_d0;
  undefined8 *local_c8;
  size_type local_c0;
  size_type *local_b8;
  size_type local_b0;
  size_type *local_a8;
  double *local_a0;
  undefined8 *local_98;
  size_type local_90;
  size_type *local_88;
  size_type local_80;
  size_type *local_78;
  undefined8 local_70;
  undefined8 *local_68;
  size_t local_60;
  size_t *local_58;
  double *local_50;
  undefined8 *local_48;
  double *local_40;
  undefined8 *local_38;
  double *local_30;
  undefined8 *local_28;
  double *local_20;
  undefined8 *local_18;
  pointer *local_10;
  undefined8 *local_8;
  
  local_678 = in_RDI + 0xb0;
  local_66c[0] = in_EDX;
  local_660 = in_RSI;
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::begin
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffff4d8);
  CLI::std::deque<helics::Input,_std::allocator<helics::Input>_>::end
            ((deque<helics::Input,_std::allocator<helics::Input>_> *)in_stack_fffffffffffff4d8);
  while (bVar1 = CLI::std::operator==(&local_698,&local_6b8), ((bVar1 ^ 0xffU) & 1) != 0) {
    local_6c0 = CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::
                operator*(&local_698);
    bVar1 = Input::isUpdated(in_stack_fffffffffffff4d8);
    if (bVar1) {
      Input::getValue<std::__cxx11::string>(in_stack_fffffffffffff4e8);
      if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4f0.internalTimeCode);
        sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                size(&local_6e0);
        if (sVar2 < 0x96) {
          if (local_66c[0] < 1) {
            local_778 = "[{}]value {}={}";
            local_770 = 0xf;
            local_780 = TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x414a82);
            local_560 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff4e0);
            local_540 = local_768;
            local_550 = local_778;
            uStack_548 = local_770;
            local_558 = &local_780;
            local_568 = &local_6e0;
            local_578 = local_778;
            uStack_570 = local_770;
            local_140 = local_780;
            local_138 = local_5b8;
            local_5b8[0] = local_780;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e8);
            local_e8 = &local_588;
            local_f0 = local_5b8;
            local_588 = 0xdda;
            local_580 = local_f0;
            ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e0);
          }
          else {
            local_730 = "[{}:{}]value {}={}";
            local_728 = 0x12;
            local_738 = TimeRepresentation::operator_cast_to_double
                                  ((TimeRepresentation<count_time<9,_long>_> *)0x414867);
            local_5e8 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff4e0);
            local_5c0 = local_720;
            local_5d0 = local_730;
            uStack_5c8 = local_728;
            local_5d8 = &local_738;
            local_5e0 = local_66c;
            local_5f0 = &local_6e0;
            local_608 = local_730;
            uStack_600 = local_728;
            local_130 = local_738;
            local_128 = local_658;
            local_658[0] = local_738;
            local_108 = local_648;
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e8);
            ::fmt::v11::detail::value<fmt::v11::context>::
            value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                      ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e8);
            local_f8 = &local_618;
            local_100 = local_658;
            local_618 = 0xdd1a;
            local_610 = local_100;
            ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
            std::__cxx11::string::~string
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffff4e0);
          }
        }
        else if (local_66c[0] < 1) {
          local_7f0 = "[{}]value {}=block[{}]";
          local_7e8 = 0x16;
          local_7f8 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x414e93);
          psVar3 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff4e0);
          local_800 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_6e0);
          local_420 = local_7e0;
          local_430 = local_7f0;
          uStack_428 = local_7e8;
          local_438 = &local_7f8;
          local_448 = &local_800;
          local_458 = local_7f0;
          uStack_450 = local_7e8;
          local_160 = local_7f8;
          local_158 = local_498;
          local_498[0] = local_7f8;
          local_440 = psVar3;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          local_b8 = local_478;
          local_c0 = *local_448;
          local_48 = &local_468;
          local_50 = local_498;
          local_468 = 0x4da;
          local_80 = local_c0;
          local_78 = local_b8;
          local_478[0] = local_c0;
          local_460 = local_50;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        else {
          local_7b0 = "[{}:{}]value {}=block[{}]";
          local_7a8 = 0x19;
          local_7b8 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x414c43);
          psVar3 = Input::getTarget_abi_cxx11_(in_stack_fffffffffffff4e0);
          local_7c0 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                                (&local_6e0);
          local_4a0 = local_7a0;
          local_4b0 = local_7b0;
          uStack_4a8 = local_7a8;
          local_4b8 = &local_7b8;
          local_4c0 = local_66c;
          local_4d0 = &local_7c0;
          local_4e8 = local_7b0;
          uStack_4e0 = local_7a8;
          local_150 = local_7b8;
          local_148 = local_538;
          local_538[0] = local_7b8;
          local_118 = local_528;
          local_4c8 = psVar3;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          local_a8 = local_508;
          local_b0 = *local_4d0;
          local_98 = &local_4f8;
          local_a0 = local_538;
          local_4f8 = 0x4d1a;
          local_90 = local_b0;
          local_88 = local_a8;
          local_508[0] = local_b0;
          local_4f0 = local_a0;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        if ((*(byte *)(in_RDI + 0xa2) & 1) == 0) {
          spdlog::info<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4150c8);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,local_700);
          std::operator<<(poVar5,'\n');
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0);
      }
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)0x4150ed);
      if (bVar1) {
        local_808 = local_660;
        Input::getTarget_abi_cxx11_(in_stack_fffffffffffff4e0);
        local_818 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff4e0);
        local_828 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff4e0);
        __args_1._M_str = in_stack_fffffffffffff4f8;
        __args_1._M_len = in_stack_fffffffffffff4f0.internalTimeCode;
        __args_2._M_str = (char *)in_stack_fffffffffffff4e8;
        __args_2._M_len = (size_t)in_stack_fffffffffffff4e0;
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                      *)in_stack_fffffffffffff4d8,in_stack_fffffffffffff500,__args_1,__args_2);
      }
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff4e0);
    }
    CLI::std::_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*>::operator++
              ((_Deque_iterator<helics::Input,_helics::Input_&,_helics::Input_*> *)
               in_stack_fffffffffffff4e0);
  }
  local_830 = in_RDI + 0x130;
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::begin
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_stack_fffffffffffff4d8
            );
  CLI::std::deque<helics::Endpoint,_std::allocator<helics::Endpoint>_>::end
            ((deque<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)in_stack_fffffffffffff4d8
            );
  while( true ) {
    bVar1 = CLI::std::operator==(&local_850,&local_870);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_878 = CLI::std::_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*>
                ::operator*(&local_850);
    while( true ) {
      bVar1 = Endpoint::hasMessage((Endpoint *)in_stack_fffffffffffff4e0);
      if (!bVar1) break;
      Endpoint::getMessage((Endpoint *)in_stack_fffffffffffff4e8);
      if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4f0.internalTimeCode);
        pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                           ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            0x4152c0);
        sVar7 = SmallBuffer::size(&pMVar6->data);
        if (sVar7 < 0x32) {
          local_8d0 = "[{}]message from {} to {}::{}";
          local_8c8 = 0x1d;
          local_8d8 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x415310);
          pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x41532e);
          pMVar8 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415349);
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x415362)
          ;
          sVar9 = SmallBuffer::to_string((SmallBuffer *)0x41536e);
          local_2e0 = &stack0xfffffffffffff740;
          local_2f0 = local_8d0;
          uStack_2e8 = local_8c8;
          local_2f8 = &local_8d8;
          local_310 = &local_8e8;
          local_328 = local_8d0;
          uStack_320 = local_8c8;
          local_180 = local_8d8;
          local_178 = local_378;
          local_378[0] = local_8d8;
          local_308 = &pMVar8->dest;
          local_300 = &pMVar6->source;
          local_8e8 = sVar9;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4e8);
          local_38 = &local_338;
          local_40 = local_378;
          local_338 = 0xddda;
          local_330 = local_40;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        else {
          local_920._8_8_ = "[{}]message from {} to {}:: size {}";
          local_910 = 1.72922976044436e-322;
          local_920._0_8_ =
               TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x415580);
          pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x41559e);
          pMVar8 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x4155b9);
          pMVar4 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x4155d2);
          local_928 = SmallBuffer::size(&pMVar4->data);
          local_1a8 = local_908;
          local_1b8 = (char *)local_920._8_8_;
          dStack_1b0 = local_910;
          local_1c0 = local_920;
          local_1d8 = &local_928;
          local_1e8 = (char *)local_920._8_8_;
          dStack_1e0 = local_910;
          local_1a0 = (double)local_920._0_8_;
          local_198 = local_238;
          local_238[0] = (double)local_920._0_8_;
          local_1d0 = &pMVar8->dest;
          local_1c8 = &pMVar6->source;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          local_d8 = local_208;
          local_e0 = *local_1d8;
          local_18 = &local_1f8;
          local_20 = local_238;
          local_1f8 = 0x4dda;
          local_60 = local_e0;
          local_58 = local_d8;
          local_208[0] = local_e0;
          local_1f0 = local_20;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        if ((*(byte *)(in_RDI + 0xa2) & 1) == 0) {
          spdlog::info<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x41581a);
        }
        else {
          poVar5 = std::operator<<((ostream *)&std::cout,local_8a0);
          std::operator<<(poVar5,'\n');
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0);
      }
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                          *)0x41583f);
      if (bVar1) {
        local_930._M_p = (pointer)local_660;
        Interface::getName_abi_cxx11_(&in_stack_fffffffffffff4e0->super_Interface);
        local_940 = std::__cxx11::string::operator_cast_to_basic_string_view
                              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               in_stack_fffffffffffff4e0);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4e0,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4d8);
        __args_1_00._M_str = in_stack_fffffffffffff4f8;
        __args_1_00._M_len = in_stack_fffffffffffff4f0.internalTimeCode;
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
        ::operator()((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                      *)in_stack_fffffffffffff4e8,in_stack_fffffffffffff500,__args_1_00,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffff4e0);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4f0.internalTimeCode);
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffff4f0.internalTimeCode);
    }
    CLI::std::_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*>::operator++
              ((_Deque_iterator<helics::Endpoint,_helics::Endpoint_&,_helics::Endpoint_*> *)
               in_stack_fffffffffffff4e0);
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)
                     0x415976);
  if (bVar1) {
    while( true ) {
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x415995);
      bVar1 = Endpoint::hasMessage((Endpoint *)in_stack_fffffffffffff4e0);
      if (!bVar1) break;
      CLI::std::unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_>::operator->
                ((unique_ptr<helics::Endpoint,_std::default_delete<helics::Endpoint>_> *)0x4159ba);
      Endpoint::getMessage((Endpoint *)in_stack_fffffffffffff4e8);
      if ((*(byte *)(in_RDI + 0xa0) & 1) != 0) {
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4f0.internalTimeCode);
        pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                           ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                            0x4159f9);
        sVar7 = SmallBuffer::size(&pMVar6->data);
        if (sVar7 < 0x32) {
          local_9a0 = "[{}]message from {} to {}::{}";
          local_998._M_first._M_storage = (_Uninitialized<double,_true>)1.43279037293961e-322;
          local_9a8 = TimeRepresentation::operator_cast_to_double
                                ((TimeRepresentation<count_time<9,_long>_> *)0x415a43);
          pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415a5e);
          pMVar8 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415a73);
          in_stack_fffffffffffff528 = &pMVar8->original_dest;
          std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::operator->
                    ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)0x415a88)
          ;
          sVar9 = SmallBuffer::to_string((SmallBuffer *)0x415a94);
          in_stack_fffffffffffff530 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)sVar9._M_str;
          local_380 = (long)&local_998 + 8;
          local_390 = local_9a0;
          _Stack_388._M_storage = (double)local_998._M_first._M_storage;
          local_398 = &local_9a8;
          local_3b0 = local_a08 + 0x50;
          local_3c8 = local_9a0;
          _Stack_3c0._M_storage = (double)local_998._M_first._M_storage;
          local_170 = local_9a8;
          local_168 = local_418;
          local_418[0] = local_9a8;
          local_3a8 = in_stack_fffffffffffff528;
          local_3a0 = &pMVar6->source;
          unique0x100018f5 = sVar9;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff4e8);
          local_28 = &local_3d8;
          local_30 = local_418;
          local_3d8 = 0xddda;
          local_3d0 = local_30;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        else {
          local_a08._32_8_ = "[{}]message from %s to %s:: size %d";
          local_a08._40_8_ = 0x23;
          local_a08._24_8_ =
               TimeRepresentation::operator_cast_to_double
                         ((TimeRepresentation<count_time<9,_long>_> *)0x415c94);
          pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415caf);
          psVar3 = &pMVar6->source;
          pMVar6 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415cc4);
          pMVar8 = std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::
                   operator->((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                              0x415cd9);
          local_a08._16_8_ = SmallBuffer::size(&pMVar8->data);
          local_240 = local_a08 + 0x30;
          local_250 = (char *)local_a08._32_8_;
          sStack_248 = local_a08._40_8_;
          local_258 = local_a08 + 0x18;
          local_270 = (undefined8 *)(local_a08 + 0x10);
          local_288 = (char *)local_a08._32_8_;
          sStack_280 = local_a08._40_8_;
          local_190 = (pointer)local_a08._24_8_;
          local_188 = local_2d8;
          local_2d8[0] = (pointer)local_a08._24_8_;
          local_268 = &pMVar6->original_dest;
          local_260 = psVar3;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff4f0.internalTimeCode,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e8);
          local_c8 = local_2a8;
          local_d0 = *local_270;
          local_8 = &local_298;
          local_10 = local_2d8;
          local_298 = 0x4dda;
          local_70 = local_d0;
          local_68 = local_c8;
          local_2a8[0] = local_d0;
          local_290 = local_10;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffff750,in_stack_fffffffffffff740);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                    (in_stack_fffffffffffff530,in_stack_fffffffffffff528);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff4e0);
        }
        if ((*(byte *)(in_RDI + 0xa2) & 1) == 0) {
          spdlog::info<std::__cxx11::string>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x415f0f);
        }
        else {
          in_stack_fffffffffffff4f0.internalTimeCode =
               (baseType)std::operator<<((ostream *)&std::cout,local_970);
          std::operator<<((ostream *)in_stack_fffffffffffff4f0.internalTimeCode,'\n');
        }
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0);
      }
      bVar1 = std::function::operator_cast_to_bool
                        ((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                          *)0x415f34);
      if (bVar1) {
        in_stack_fffffffffffff4e0 = (Input *)(in_RDI + 0x1d0);
        local_a08._8_8_ = local_660;
        in_stack_fffffffffffff4e8 = (Input *)local_a08;
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4e0,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4d8);
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
        ::operator()((function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
                      *)in_stack_fffffffffffff4e8,in_stack_fffffffffffff4f0,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                     in_stack_fffffffffffff4e0);
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                   in_stack_fffffffffffff4f0.internalTimeCode);
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                 in_stack_fffffffffffff4f0.internalTimeCode);
    }
  }
  return;
}

Assistant:

void Tracer::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();

            if (printMessage) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                if (skiplog) {
                    std::cout << valstr << '\n';
                } else {
                    spdlog::info(valstr);
                }
            }
            if (valueCallback) {
                valueCallback(currentTime, sub.getTarget(), val);
            }
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (endpointMessageCallback) {
                endpointMessageCallback(currentTime, ept.getName(), std::move(mess));
            }
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            auto mess = cloneEndpoint->getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from %s to %s:: size %d",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (clonedMessageCallback) {
                clonedMessageCallback(currentTime, std::move(mess));
            }
        }
    }
}